

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O1

void bb_color(long param_1,long param_2)

{
  _List_node_base *p_Var1;
  size_t __i;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  list<int,_std::allocator<int>_> lv;
  Vset cur;
  undefined8 *local_7a8;
  undefined1 *local_7a0;
  long local_798;
  long local_790;
  ulong local_788 [235];
  
  local_7a0 = (undefined1 *)&local_7a8;
  local_7a8 = &local_7a8;
  local_798 = 0;
  local_790 = param_2;
  if (0 < size) {
    uVar7 = 0;
    local_7a8 = &local_7a8;
    local_7a0 = (undefined1 *)&local_7a8;
    do {
      if (((ulong)(&lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                    super__List_node_base._M_prev)[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0) {
        p_Var1 = (_List_node_base *)operator_new(0x18);
        *(int *)&p_Var1[1]._M_next = (int)uVar7;
        std::__detail::_List_node_base::_M_hook(p_Var1);
        local_798 = local_798 + 1;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)size);
  }
  if ((undefined8 **)local_7a8 != &local_7a8) {
    iVar5 = 0;
    iVar6 = 0;
    do {
      puVar3 = local_7a8;
      memcpy(local_788,
             &lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
              _M_prev,0x758);
      iVar5 = iVar5 + 1;
      do {
        uVar7 = (ulong)*(int *)(puVar3 + 2);
        if ((local_788[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
          puVar4 = (undefined8 *)*puVar3;
        }
        else {
          lVar2 = 0;
          do {
            local_788[lVar2] = local_788[lVar2] & NC[uVar7].super__Base_bitset<235UL>._M_w[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 0xeb);
          std::bitset<15000UL>::reset
                    ((bitset<15000UL> *)
                     &lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                      super__List_node_base._M_prev,uVar7);
          lVar2 = (long)iVar6;
          *(undefined4 *)(param_1 + lVar2 * 4) = *(undefined4 *)(puVar3 + 2);
          iVar6 = iVar6 + 1;
          *(int *)(local_790 + lVar2 * 4) = iVar5;
          puVar4 = (undefined8 *)*puVar3;
          local_798 = local_798 + -1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(puVar3);
        }
        puVar3 = puVar4;
      } while ((undefined8 **)puVar4 != &local_7a8);
    } while ((undefined8 **)local_7a8 != &local_7a8);
  }
  return;
}

Assistant:

void bb_color(Vset C, int *U, int *color) {
    int cnt_color = 0, pt = 0;
    list<int> lv;
    for (int v = 0; v < size; ++v)
        if (C[v]) lv.push_back(v);

    while(!lv.empty()) {
        Vset cur = C;
        ++cnt_color;
        for (list<int>::iterator it = lv.begin(); it != lv.end(); ) {
            if (cur[*it]) {
                cur &= NC[*it];
                C.reset(*it);
                U[pt] = *it;
                color[pt++] = cnt_color;
                it = lv.erase(it);
            } else ++it;
        }
    }
}